

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CreateTokenizer(fts5_api *pApi,char *zName,void *pUserData,fts5_tokenizer *pTokenizer,
                       _func_void_void_ptr *xDestroy)

{
  long lVar1;
  int iVar2;
  Fts5TokenizerModule **in_RCX;
  _func_void_void_ptr *in_RDX;
  void *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int rc;
  Fts5TokenizerModule *pNew;
  long lVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  iVar2 = fts5NewTokenizerModule((Fts5Global *)0x0,in_RDI,in_RSI,in_RDX,in_RCX);
  if (lVar3 != 0) {
    *(Fts5TokenizerModule **)(lVar3 + 0x18) = *in_RCX;
    *(Fts5TokenizerModule **)(lVar3 + 0x20) = in_RCX[1];
    *(Fts5TokenizerModule **)(lVar3 + 0x28) = in_RCX[2];
    *(code **)(lVar3 + 0x38) = fts5VtoVCreate;
    *(code **)(lVar3 + 0x48) = fts5V2toV1Tokenize;
    *(code **)(lVar3 + 0x40) = fts5VtoVDelete;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5CreateTokenizer(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void *pUserData,                /* User data for aux. function */
  fts5_tokenizer *pTokenizer,     /* Tokenizer implementation */
  void(*xDestroy)(void*)          /* Destructor for pUserData */
){
  Fts5TokenizerModule *pNew = 0;
  int rc = SQLITE_OK;

  rc = fts5NewTokenizerModule(
      (Fts5Global*)pApi, zName, pUserData, xDestroy, &pNew
  );
  if( pNew ){
    pNew->x1 = *pTokenizer;
    pNew->x2.xCreate = fts5VtoVCreate;
    pNew->x2.xTokenize = fts5V2toV1Tokenize;
    pNew->x2.xDelete = fts5VtoVDelete;
  }
  return rc;
}